

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::StrPair::TransferTo(StrPair *this,StrPair *other)

{
  StrPair *in_RSI;
  StrPair *in_RDI;
  
  if (in_RDI != in_RSI) {
    Reset(in_RSI);
    in_RSI->_flags = in_RDI->_flags;
    in_RSI->_start = in_RDI->_start;
    in_RSI->_end = in_RDI->_end;
    in_RDI->_flags = 0;
    in_RDI->_start = (char *)0x0;
    in_RDI->_end = (char *)0x0;
  }
  return;
}

Assistant:

void StrPair::TransferTo( StrPair* other )
{
    if ( this == other ) {
        return;
    }
    // This in effect implements the assignment operator by "moving"
    // ownership (as in auto_ptr).

    TIXMLASSERT( other->_flags == 0 );
    TIXMLASSERT( other->_start == 0 );
    TIXMLASSERT( other->_end == 0 );

    other->Reset();

    other->_flags = _flags;
    other->_start = _start;
    other->_end = _end;

    _flags = 0;
    _start = 0;
    _end = 0;
}